

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::Index::Index
          (Index *this,LocationRange *lr,Fodder *open_fodder,AST *target,Fodder *dot_fodder,
          Fodder *id_fodder,Identifier *id)

{
  undefined8 in_RCX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDX;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RSI;
  undefined8 *in_RDI;
  AST *in_R9;
  undefined8 in_stack_00000008;
  Fodder *in_stack_ffffffffffffffb8;
  ASTType in_stack_ffffffffffffffc4;
  LocationRange *in_stack_ffffffffffffffc8;
  
  AST::AST(in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__Index_00467f78;
  in_RDI[0x10] = in_RCX;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(in_RSI,in_RDX);
  *(undefined1 *)(in_RDI + 0x14) = 0;
  in_RDI[0x15] = 0;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x2a8514);
  in_RDI[0x19] = 0;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)0x2a8535);
  in_RDI[0x1d] = 0;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(in_RSI,in_RDX);
  in_RDI[0x21] = in_stack_00000008;
  return;
}

Assistant:

Index(const LocationRange &lr, const Fodder &open_fodder, AST *target, const Fodder &dot_fodder,
          const Fodder &id_fodder, const Identifier *id)
        : AST(lr, AST_INDEX, open_fodder),
          target(target),
          dotFodder(dot_fodder),
          isSlice(false),
          index(nullptr),
          end(nullptr),
          step(nullptr),
          idFodder(id_fodder),
          id(id)
    {
    }